

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

Region * __thiscall
FlowGraph::PropagateRegionFromPred
          (FlowGraph *this,BasicBlock *block,BasicBlock *predBlock,Region *predRegion,
          Instr **tryInstr)

{
  IRKind IVar1;
  OpCode OVar2;
  BasicBlock *pBVar3;
  Instr *this_00;
  Instr *pIVar4;
  code *pcVar5;
  bool bVar6;
  Region *pRVar7;
  undefined4 *puVar8;
  Region *pRVar9;
  Instr *pIVar10;
  long lVar11;
  Func **ppFVar12;
  uint lineNumber;
  
  pBVar3 = predBlock->next;
  ppFVar12 = &predBlock->func;
  if (pBVar3 != (BasicBlock *)0x0) {
    ppFVar12 = (Func **)&pBVar3->firstInstr;
  }
  lVar11 = 0x18;
  if (pBVar3 == (BasicBlock *)0x0) {
    lVar11 = 0xd0;
  }
  pIVar10 = *(Instr **)((long)&(*ppFVar12)->m_alloc + lVar11);
  if (pIVar10 == (Instr *)0x0) {
    return predRegion;
  }
  this_00 = block->firstInstr;
  OVar2 = pIVar10->m_opcode;
  switch(OVar2) {
  case TryCatch:
    IVar1 = pIVar10->m_next->m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x7e4,"(predLastInstr->m_next->IsLabelInstr())",
                         "predLastInstr->m_next->IsLabelInstr()");
      if (!bVar6) goto LAB_0041e5e0;
      *puVar8 = 0;
    }
    pIVar4 = pIVar10->m_next;
    IVar1 = pIVar4->m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar6) goto LAB_0041e5e0;
      *puVar8 = 0;
    }
    pRVar9 = (Region *)pIVar4[1].m_src2;
    if (pIVar10->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar6) goto LAB_0041e5e0;
      *puVar8 = 0;
    }
    if (this_00 != pIVar10[1].m_next) {
      pRVar9 = Region::New(RegionTypeTry,predRegion,this->func);
      *tryInstr = pIVar10;
      return pRVar9;
    }
    pRVar7 = Region::New(RegionTypeCatch,predRegion,this->func);
    if (pRVar9 != (Region *)0x0) {
LAB_0041e5d2:
      pRVar7->matchingTryRegion = pRVar9;
      pRVar9->matchingCatchRegion = pRVar7;
      return pRVar7;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x7eb,"(tryRegion)","tryRegion");
    if (bVar6) {
      *puVar8 = 0;
      goto LAB_0041e5d2;
    }
    goto LAB_0041e5e0;
  case TryFinally:
    IVar1 = pIVar10->m_next->m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x7f9,"(predLastInstr->m_next->IsLabelInstr())",
                         "predLastInstr->m_next->IsLabelInstr()");
      if (!bVar6) goto LAB_0041e5e0;
      *puVar8 = 0;
    }
    pIVar4 = pIVar10->m_next;
    IVar1 = pIVar4->m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar6) goto LAB_0041e5e0;
      *puVar8 = 0;
    }
    pRVar9 = (Region *)pIVar4[1].m_src2;
    if (pIVar10->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar6) goto LAB_0041e5e0;
      *puVar8 = 0;
    }
    if (this_00 != pIVar10[1].m_next) {
      pRVar9 = Region::New(RegionTypeTry,predRegion,this->func);
      *tryInstr = pIVar10;
      return pRVar9;
    }
    if ((pRVar9 == (Region *)0x0) || (pRVar9->type != RegionTypeTry)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x7ff,"(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)",
                         "tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
      if (!bVar6) goto LAB_0041e5e0;
      *puVar8 = 0;
    }
    pRVar7 = Region::New(RegionTypeFinally,predRegion,this->func);
    pRVar7->matchingTryRegion = pRVar9;
    pRVar9->matchingFinallyOnExceptRegion = pRVar7;
    *tryInstr = pIVar10;
    return pRVar7;
  case Catch:
    goto switchD_0041dee7_caseD_e9;
  case LeaveNull:
    if (predRegion->parent != (Region *)0x0) {
      return predRegion->parent;
    }
    bVar6 = Func::IsLoopBodyInTry(this->func);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      lineNumber = 0x82a;
LAB_0041e451:
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,lineNumber,"(this->func->IsLoopBodyInTry())",
                         "this->func->IsLoopBodyInTry()");
      if (!bVar6) goto LAB_0041e5e0;
      *puVar8 = 0;
    }
    break;
  case Leave:
    if ((this_00->m_next != (Instr *)0x0) && (this_00->m_next->m_opcode == Finally)) {
      if (predRegion->matchingFinallyOnExceptRegion == (Region *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x810,"(tryRegion->GetMatchingFinallyRegion(true) != nullptr)",
                           "tryRegion->GetMatchingFinallyRegion(true) != nullptr");
        if (!bVar6) goto LAB_0041e5e0;
        *puVar8 = 0;
      }
      pRVar9 = Region::New(RegionTypeFinally,predRegion->parent,this->func);
      if (predRegion->type != RegionTypeTry) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x812,"(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)"
                           ,"tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
        if (!bVar6) goto LAB_0041e5e0;
        *puVar8 = 0;
      }
      pRVar9->matchingTryRegion = predRegion;
      predRegion->matchingFinallyOnNoExceptRegion = pRVar9;
      return pRVar9;
    }
    if (predRegion->parent != (Region *)0x0) {
      return predRegion->parent;
    }
    bVar6 = Func::IsLoopBodyInTry(this->func);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      lineNumber = 0x81e;
      goto LAB_0041e451;
    }
    break;
  default:
    if (OVar2 == BrOnException) {
      if ((predRegion->type != RegionTypeFinally) &&
         (pIVar10 = IR::Instr::GetNextRealInstr(this_00), pIVar10->m_opcode == LeaveNull)) {
        return predRegion->parent;
      }
    }
    else if (OVar2 == BailOnException) {
      if ((this_00->m_next == (Instr *)0x0) || (this_00->m_next->m_opcode != Finally)) {
        return (Region *)0x0;
      }
      pRVar9 = predRegion->matchingTryRegion;
      pRVar7 = Region::New(RegionTypeFinally,predRegion->parent,this->func);
      if ((pRVar9 == (Region *)0x0) || (pRVar9->type != RegionTypeTry)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x835,"(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry)"
                           ,"tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry");
        if (!bVar6) goto LAB_0041e5e0;
        *puVar8 = 0;
      }
      pRVar7->matchingTryRegion = pRVar9;
      pRVar9->matchingFinallyOnNoExceptRegion = pRVar7;
      return pRVar7;
    }
    goto switchD_0041dee7_caseD_e9;
  }
  if (pIVar10->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar6) {
LAB_0041e5e0:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  *(byte *)&pIVar10[1]._vptr_Instr = *(byte *)&pIVar10[1]._vptr_Instr | 4;
switchD_0041dee7_caseD_e9:
  return predRegion;
}

Assistant:

Region *
FlowGraph::PropagateRegionFromPred(BasicBlock * block, BasicBlock * predBlock, Region * predRegion, IR::Instr * &tryInstr)
{
    // Propagate predRegion to region, looking at the flow transition for an opcode
    // that affects the region.
    Region * region = nullptr;
    IR::Instr * predLastInstr = predBlock->GetLastInstr();
    IR::Instr * firstInstr = block->GetFirstInstr();
    if (predLastInstr == nullptr)
    {
        // Empty block: trivially propagate the region.
        region = predRegion;
    }
    else
    {
        Region * tryRegion = nullptr;
        IR::LabelInstr * tryInstrNext = nullptr;
        switch (predLastInstr->m_opcode)
        {
        case Js::OpCode::TryCatch:
            // Entry to a try-catch. See whether we're entering the try or the catch
            // by looking for the handler label.
            Assert(predLastInstr->m_next->IsLabelInstr());
            tryInstrNext = predLastInstr->m_next->AsLabelInstr();
            tryRegion = tryInstrNext->GetRegion();

            if (firstInstr == predLastInstr->AsBranchInstr()->GetTarget())
            {
                region = Region::New(RegionTypeCatch, predRegion, this->func);
                Assert(tryRegion);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingCatchRegion(region);
            }
            else
            {
                region = Region::New(RegionTypeTry, predRegion, this->func);
                tryInstr = predLastInstr;
            }
            break;

        case Js::OpCode::TryFinally:
            // Entry to a try-finally. See whether we're entering the try or the finally
            // by looking for the handler label.
            Assert(predLastInstr->m_next->IsLabelInstr());
            tryInstrNext = predLastInstr->m_next->AsLabelInstr();
            tryRegion = tryInstrNext->GetRegion();

            if (firstInstr == predLastInstr->AsBranchInstr()->GetTarget())
            {
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region = Region::New(RegionTypeFinally, predRegion, this->func);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, true);
                tryInstr = predLastInstr;
            }
            else
            {
                region = Region::New(RegionTypeTry, predRegion, this->func);
                tryInstr = predLastInstr;
            }
            break;

        case Js::OpCode::Leave:
            if (firstInstr->m_next && firstInstr->m_next->m_opcode == Js::OpCode::Finally)
            {
                tryRegion = predRegion;
                Assert(tryRegion->GetMatchingFinallyRegion(true) != nullptr);
                region = Region::New(RegionTypeFinally, predRegion->GetParent(), this->func);
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, false);
                break;
            }

            // Exiting a try or handler. Retrieve the current region's parent.
            region = predRegion->GetParent();
            if (region == nullptr)
            {
                // We found a Leave in the root region- this can only happen when a jitted loop body
                // in a try block has a return statement.
                Assert(this->func->IsLoopBodyInTry());
                predLastInstr->AsBranchInstr()->m_isOrphanedLeave = true;
                region = predRegion;
            }
            break;
        case Js::OpCode::LeaveNull:
            // Exiting a try or handler. Retrieve the current region's parent.
            region = predRegion->GetParent();
            if (region == nullptr)
            {
                // We found a Leave in the root region- this can only happen when a jitted loop body
                // in a try block has a return statement.
                Assert(this->func->IsLoopBodyInTry());
                predLastInstr->AsBranchInstr()->m_isOrphanedLeave = true;
                region = predRegion;
            }
            break;
        case Js::OpCode::BailOnException:
            // Infinite loop, no edge to non excepting finally
            if (firstInstr->m_next && firstInstr->m_next->m_opcode == Js::OpCode::Finally)
            {
                tryRegion = predRegion->GetMatchingTryRegion();
                region = Region::New(RegionTypeFinally, predRegion->GetParent(), this->func);
                Assert(tryRegion && tryRegion->GetType() == RegionType::RegionTypeTry);
                region->SetMatchingTryRegion(tryRegion);
                tryRegion->SetMatchingFinallyRegion(region, false);
            }
            break;
        case Js::OpCode::BrOnException:
            // Infinite loop inside another EH region within finally,
            // We have added edges for all infinite loops inside a finally, identify that and transition to parent
            if (predRegion->GetType() != RegionTypeFinally && firstInstr->GetNextRealInstr()->m_opcode == Js::OpCode::LeaveNull)
            {
                region = predRegion->GetParent();
            }
            else
            {
                region = predRegion;
            }
            break;
        default:
            // Normal (non-EH) transition: just propagate the region.
            region = predRegion;
            break;
        }
    }
    return region;
}